

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDReplayExecution(JsTTDMoveMode *moveMode,int64_t *rootEventTime)

{
  anon_class_24_3_8a912c18 fn;
  bool bVar1;
  ThreadContext **in_stack_ffffffffffffff30;
  TTDebuggerAbortException abortException;
  JsErrorCode res;
  UnorderedArrayListLink *pUStack_50;
  JsErrorCode bpstatus;
  ExecutionInfoManager *emanager;
  EventLog *elog;
  ThreadContext *threadContext;
  ScriptContext *scriptContext;
  JsrtContext *pJStack_28;
  JsErrorCode cCheck;
  JsrtContext *currentContext;
  int64_t *rootEventTime_local;
  JsTTDMoveMode *moveMode_local;
  
  currentContext = (JsrtContext *)rootEventTime;
  rootEventTime_local = (int64_t *)moveMode;
  pJStack_28 = JsrtContext::GetCurrent();
  scriptContext._4_4_ = CheckContext(pJStack_28,false,false);
  if (scriptContext._4_4_ != JsNoError) {
    TTDAbort_unrecoverable_error("This shouldn\'t happen!!!");
  }
  threadContext = (ThreadContext *)JsrtContext::GetScriptContext(pJStack_28);
  elog = (EventLog *)Js::ScriptContext::GetThreadContext((ScriptContext *)threadContext);
  bVar1 = ThreadContext::IsRuntimeInTTDMode((ThreadContext *)elog);
  if (bVar1) {
    emanager = (ExecutionInfoManager *)elog[7].m_propertyRecordList.m_alloc;
    pUStack_50 = elog[7].m_propertyRecordList.m_inlineHeadBlock.Next;
    if ((pUStack_50 == (UnorderedArrayListLink *)0x0) ||
       (fn.emanager = (ExecutionInfoManager **)&elog,
       fn.moveMode = (JsTTDMoveMode **)&stack0xffffffffffffffb0,
       fn.threadContext = in_stack_ffffffffffffff30,
       moveMode_local._4_4_ = GlobalAPIWrapper_NoRecord<JsTTDReplayExecution::__0>(fn),
       moveMode_local._4_4_ == JsNoError)) {
      *(undefined4 *)rootEventTime_local = 0;
      (currentContext->super_FinalizableObject).super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject = (_func_int **)0xffffffffffffffff;
      TTD::EventLog::ReplayRootEventsToTime((EventLog *)emanager,0x7fffffffffffffff);
      moveMode_local._4_4_ = JsNoError;
    }
    return moveMode_local._4_4_;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDReplayExecution(_Inout_ JsTTDMoveMode* moveMode, _Out_ int64_t* rootEventTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtContext *currentContext = JsrtContext::GetCurrent();
    JsErrorCode cCheck = CheckContext(currentContext, JSRT_MAYBE_TRUE);
    TTDAssert(cCheck == JsNoError, "This shouldn't happen!!!");

    Js::ScriptContext* scriptContext = currentContext->GetScriptContext();
    ThreadContext* threadContext = scriptContext->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    TTD::EventLog* elog = threadContext->TTDLog;
    TTD::ExecutionInfoManager* emanager = threadContext->TTDExecutionInfo;

    if(emanager != nullptr)
    {
        JsErrorCode bpstatus = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            if((*moveMode & JsTTDMoveMode::JsTTDMoveBreakOnEntry) == JsTTDMoveMode::JsTTDMoveBreakOnEntry)
            {
                emanager->SetBreakOnFirstUserCode();
            }

            //Set the active BP info from the manager (so we will hit the BP in step back operations)
            emanager->SetActiveBPInfoAsNeeded(threadContext->TTDContext);

            return JsNoError;
        });

        if(bpstatus != JsNoError)
        {
            return bpstatus;
        }
    }

    *moveMode = JsTTDMoveMode::JsTTDMoveNone;
    *rootEventTime = -1;
    JsErrorCode res = JsNoError;
    try
    {
        elog->ReplayRootEventsToTime(TTD_EVENT_MAXTIME);
    }
    catch(TTD::TTDebuggerAbortException abortException)
    {
        //if the debugger bails out with a move time request set info on the requested event time here
        //rest of breakpoint info should have been set by the debugger callback before aborting
        if (abortException.IsEventTimeMove() || abortException.IsTopLevelException())
        {
            *moveMode = (JsTTDMoveMode)abortException.GetMoveMode();
            *rootEventTime = abortException.GetTargetEventTime();

            //Check if we are tracking execution and, if so, set the exception location so we can access it later
            if(emanager != nullptr && abortException.IsTopLevelException())
            {
                emanager->SetPendingTTDUnhandledException();
            }
        }

        res = abortException.IsTopLevelException() ? JsErrorCategoryScript : JsNoError;
    }
    catch(...)
    {
        res = JsErrorFatal;
        TTDAssert(false, "Unexpected fatal Error");
    }

    return res;
#endif
}